

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::JitAllocator::release(JitAllocator *this,void *rx)

{
  bool bVar1;
  JitAllocatorBlock *this_00;
  JitAllocatorPool *pJVar2;
  uint8_t *puVar3;
  JitAllocatorBlock *in_RSI;
  JitAllocatorPrivateImpl *in_RDI;
  ProtectJitReadWriteScope scope;
  size_t spanSize;
  uint8_t *spanPtr;
  uint32_t areaSize;
  uint32_t areaEnd;
  uint32_t areaIndex;
  size_t offset;
  JitAllocatorPool *pool;
  JitAllocatorBlock *block;
  LockGuard guard;
  JitAllocatorPrivateImpl *impl;
  CachePolicy in_stack_ffffffffffffff3c;
  JitAllocatorBlock *block_00;
  JitAllocatorBlock *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  void *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  JitAllocatorBlock *in_stack_ffffffffffffff70;
  pthread_mutex_t *local_50;
  JitAllocatorOptions *local_48;
  JitAllocatorBlock *local_40;
  Error local_2c;
  pthread_mutex_t *local_28;
  pthread_mutex_t **local_20;
  pthread_mutex_t **local_18;
  pthread_mutex_t *local_10;
  pthread_mutex_t *local_8;
  
  if (*(undefined1 **)&in_RDI->super_Impl == JitAllocatorImpl_none) {
    local_2c = DebugUtils::errored(5);
  }
  else if (in_RSI == (JitAllocatorBlock *)0x0) {
    local_2c = DebugUtils::errored(2);
  }
  else {
    local_48 = *(JitAllocatorOptions **)&in_RDI->super_Impl;
    local_28 = (pthread_mutex_t *)(local_48 + 4);
    local_20 = &local_50;
    local_40 = in_RSI;
    local_10 = local_28;
    local_50 = local_28;
    pthread_mutex_lock(local_28);
    this_00 = ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
              get<unsigned_char*,asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
                        ((ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (uchar **)in_stack_ffffffffffffff50,
                         (Compare<(asmjit::v1_14::Support::SortOrder)0> *)in_RDI);
    if (this_00 == (JitAllocatorBlock *)0x0) {
      local_2c = DebugUtils::errored(3);
    }
    else {
      pJVar2 = JitAllocatorBlock::pool(this_00);
      puVar3 = JitAllocatorBlock::rxPtr(this_00);
      Support::bitVectorIndexOf<unsigned_long>
                (this_00->_stopBitVector,
                 (ulong)((long)local_40 - (long)puVar3) >> (pJVar2->granularityLog2 & 0x3f) &
                 0xffffffff,true);
      *(undefined8 *)(local_48 + 0x10) = *(undefined8 *)(local_48 + 0x10) - kUseDualMapping;
      JitAllocatorBlock::markReleasedArea
                (in_stack_ffffffffffffff70,(uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff68);
      bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                        (*local_48,kFillUnusedMemory);
      block_00 = local_40;
      if (bVar1) {
        JitAllocatorBlock::rwPtr(this_00);
        VirtMem::ProtectJitReadWriteScope::ProtectJitReadWriteScope
                  ((ProtectJitReadWriteScope *)in_stack_ffffffffffffff50,in_RDI,(size_t)local_40,
                   in_stack_ffffffffffffff3c);
        JitAllocatorImpl_fillPattern
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                   (size_t)in_stack_ffffffffffffff50);
        VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope
                  ((ProtectJitReadWriteScope *)local_40);
        block_00 = local_40;
      }
      bVar1 = JitAllocatorBlock::empty((JitAllocatorBlock *)0x145053);
      if (bVar1) {
        if ((pJVar2->emptyBlockCount != '\0') ||
           (bVar1 = Support::
                    test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                              (*local_48,kImmediateRelease), bVar1)) {
          JitAllocatorImpl_removeBlock
                    ((JitAllocatorPrivateImpl *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50);
          JitAllocatorImpl_deleteBlock(in_RDI,block_00);
        }
        else {
          pJVar2->emptyBlockCount = pJVar2->emptyBlockCount + '\x01';
        }
      }
      local_2c = 0;
    }
    local_18 = &local_50;
    local_8 = local_50;
    pthread_mutex_unlock(local_50);
  }
  return local_2c;
}

Assistant:

Error JitAllocator::release(void* rx) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!rx))
    return DebugUtils::errored(kErrorInvalidArgument);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  LockGuard guard(impl->lock);

  JitAllocatorBlock* block = impl->tree.get(static_cast<uint8_t*>(rx));
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidState);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)rx - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaIndex = uint32_t(offset >> pool->granularityLog2);
  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaIndex, true)) + 1;
  uint32_t areaSize = areaEnd - areaIndex;

  impl->allocationCount--;
  block->markReleasedArea(areaIndex, areaEnd);

  // Fill the released memory if the secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + areaIndex * pool->granularity;
    size_t spanSize = areaSize * pool->granularity;

    VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize);
    JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
  }

  // Release the whole block if it became empty.
  if (block->empty()) {
    if (pool->emptyBlockCount || Support::test(impl->options, JitAllocatorOptions::kImmediateRelease)) {
      JitAllocatorImpl_removeBlock(impl, block);
      JitAllocatorImpl_deleteBlock(impl, block);
    }
    else {
      pool->emptyBlockCount++;
    }
  }

  return kErrorOk;
}